

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::putIterate(Highs *this)

{
  HighsStatus HVar1;
  
  if ((this->ekk_instance_).status_.has_invert != false) {
    HEkk::putIterate(&this->ekk_instance_);
    HVar1 = returnFromHighs(this,kOk);
    return HVar1;
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
               "putIterate: no simplex iterate to put\n");
  return kError;
}

Assistant:

HighsStatus Highs::putIterate() {
  // Check that there is a simplex iterate to put
  if (!ekk_instance_.status_.has_invert) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "putIterate: no simplex iterate to put\n");
    return HighsStatus::kError;
  }
  ekk_instance_.putIterate();
  return returnFromHighs(HighsStatus::kOk);
}